

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

bool jessilib::equalsi<char,char>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char,_std::char_traits<char>_> rhs)

{
  bool bVar1;
  jessilib *pjVar2;
  jessilib *extraout_RDX;
  jessilib *this;
  jessilib *this_00;
  char *pcVar4;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  decode_result dVar5;
  decode_result dVar6;
  char *local_38;
  size_t sVar3;
  
  local_38 = rhs._M_str;
  pjVar2 = (jessilib *)rhs._M_len;
  pcVar4 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  this_00 = this;
  if (this == pjVar2) {
    for (; (this_00 != (jessilib *)0x0 && (this != (jessilib *)0x0)); this = this + -sVar3) {
      in_string._M_str = (char *)pjVar2;
      in_string._M_len = (size_t)pcVar4;
      dVar5 = decode_codepoint_utf8<char>(this_00,in_string);
      in_string_00._M_str = (char *)dVar5.units;
      in_string_00._M_len = (size_t)local_38;
      dVar6 = decode_codepoint_utf8<char>(this,in_string_00);
      sVar3 = dVar6.units;
      if (in_string_00._M_str == (char *)0x0) {
        return false;
      }
      if (sVar3 == 0) {
        return false;
      }
      bVar1 = equalsi(dVar5.codepoint,dVar6.codepoint);
      if (!bVar1) goto LAB_00108f9d;
      pcVar4 = pcVar4 + (long)in_string_00._M_str;
      local_38 = local_38 + sVar3;
      pjVar2 = extraout_RDX;
      this_00 = this_00 + -(long)in_string_00._M_str;
    }
    bVar1 = this_00 == (jessilib *)0x0 && this == (jessilib *)0x0;
  }
  else {
LAB_00108f9d:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}